

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint local_ac;
  uint local_a0;
  uint32_t local_9c;
  uint local_8c;
  uint32_t len;
  uint8_t *pb;
  uint32_t *pair;
  uint local_70;
  uint32_t delta;
  uint32_t len1;
  uint32_t len0;
  uint32_t *ptr1;
  uint32_t *ptr0;
  uint32_t *son_local;
  uint32_t depth_local;
  uint32_t cur_match_local;
  uint8_t *cur_local;
  uint32_t pos_local;
  uint32_t len_limit_local;
  uint64_t x;
  uint local_c;
  
  _len1 = son + (cyclic_pos << 1);
  delta = 0;
  local_70 = 0;
  ptr1 = son + (ulong)(cyclic_pos << 1) + 1;
  son_local._0_4_ = depth;
  son_local._4_4_ = cur_match;
  while( true ) {
    uVar1 = pos - son_local._4_4_;
    if (((uint32_t)son_local == 0) || (cyclic_size <= uVar1)) {
      *ptr1 = 0;
      *_len1 = 0;
      return matches;
    }
    if (cyclic_pos < uVar1) {
      local_9c = cyclic_size;
    }
    else {
      local_9c = 0;
    }
    puVar3 = son + ((cyclic_pos - uVar1) + local_9c) * 2;
    if (delta < local_70) {
      local_a0 = delta;
    }
    else {
      local_a0 = local_70;
    }
    local_8c = local_a0;
    if (cur[(ulong)local_a0 - (ulong)uVar1] == cur[local_a0]) break;
LAB_00b96795:
    if (cur[(ulong)local_8c - (ulong)uVar1] < cur[local_8c]) {
      *_len1 = son_local._4_4_;
      _len1 = puVar3 + 1;
      son_local._4_4_ = *_len1;
      local_70 = local_8c;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
    else {
      *ptr1 = son_local._4_4_;
      son_local._4_4_ = *puVar3;
      delta = local_8c;
      ptr1 = puVar3;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
  }
  x._4_4_ = local_a0 + 1;
  if (len_limit < x._4_4_) {
    __assert_fail("len <= limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                  ,0x2e,
                  "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)");
  }
  if (0x7fffffff < len_limit) {
    __assert_fail("limit <= UINT32_MAX / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                  ,0x2f,
                  "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)");
  }
LAB_00b9668b:
  local_c = len_limit;
  if (x._4_4_ < len_limit) {
    uVar4 = read64ne(cur + ((ulong)x._4_4_ - (ulong)uVar1));
    uVar5 = read64ne(cur + x._4_4_);
    uVar6 = uVar4 - uVar5;
    if (uVar6 == 0) goto LAB_00b9670d;
    uVar2 = 0;
    for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
      uVar2 = uVar2 + 1;
    }
    uVar2 = (uVar2 >> 3) + x._4_4_;
    local_ac = len_limit;
    if (uVar2 < len_limit) {
      local_ac = uVar2;
    }
    local_c = local_ac;
  }
  local_8c = local_c;
  if (len_best < local_c) {
    len_best = local_c;
    matches->len = local_c;
    matches->dist = uVar1 - 1;
    matches = matches + 1;
    if (local_c == len_limit) {
      *_len1 = *puVar3;
      *ptr1 = puVar3[1];
      return matches;
    }
  }
  goto LAB_00b96795;
LAB_00b9670d:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_00b9668b;
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		uint32_t *const pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		const uint8_t *const pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}